

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_rep(lua_State *L)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *__src;
  char *__src_00;
  char *pcVar4;
  char *local_470;
  char *p;
  luaL_Buffer b;
  size_t totallen;
  char *sep;
  lua_Integer n;
  char *s;
  size_t lsep;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  __src = luaL_checklstring(L,1,&lsep);
  sep = (char *)luaL_checkinteger((lua_State *)l,2);
  __src_00 = luaL_optlstring((lua_State *)l,3,"",(size_t *)&s);
  if ((long)sep < 1) {
    lua_pushstring((lua_State *)l,"");
  }
  else {
    bVar1 = true;
    if (lsep <= s + lsep) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = sep;
      bVar1 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0) < s + lsep;
    }
    if (bVar1) {
      iVar3 = luaL_error((lua_State *)l,"resulting string too large");
      return iVar3;
    }
    b.init._1016_8_ = (long)sep * (long)(s + lsep) - (long)s;
    local_470 = luaL_buffinitsize((lua_State *)l,(luaL_Buffer *)&p,b.init._1016_8_);
    while (pcVar4 = sep + -1, 1 < (long)sep) {
      memcpy(local_470,__src,lsep);
      local_470 = local_470 + lsep;
      sep = pcVar4;
      if (s != (char *)0x0) {
        memcpy(local_470,__src_00,(size_t)s);
        local_470 = s + (long)local_470;
      }
    }
    memcpy(local_470,__src,lsep);
    luaL_pushresultsize((luaL_Buffer *)&p,b.init._1016_8_);
  }
  return 1;
}

Assistant:

static int str_rep (lua_State *L) {
  size_t l, lsep;
  const char *s = luaL_checklstring(L, 1, &l);
  lua_Integer n = luaL_checkinteger(L, 2);
  const char *sep = luaL_optlstring(L, 3, "", &lsep);
  if (n <= 0)
    lua_pushliteral(L, "");
  else if (l_unlikely(l + lsep < l || l + lsep > MAX_SIZE / cast_sizet(n)))
    return luaL_error(L, "resulting string too large");
  else {
    size_t totallen = ((size_t)n * (l + lsep)) - lsep;
    luaL_Buffer b;
    char *p = luaL_buffinitsize(L, &b, totallen);
    while (n-- > 1) {  /* first n-1 copies (followed by separator) */
      memcpy(p, s, l * sizeof(char)); p += l;
      if (lsep > 0) {  /* empty 'memcpy' is not that cheap */
        memcpy(p, sep, lsep * sizeof(char));
        p += lsep;
      }
    }
    memcpy(p, s, l * sizeof(char));  /* last copy (not followed by separator) */
    luaL_pushresultsize(&b, totallen);
  }
  return 1;
}